

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O1

int av1_txfm_uvrd(AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,
                 int64_t ref_best_rd)

{
  BLOCK_SIZE plane_bsize;
  byte bVar1;
  MB_MODE_INFO *pMVar2;
  bool bVar3;
  int iVar4;
  byte tx_size;
  long lVar5;
  int plane;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  RD_STATS this_rd_stats;
  
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->sse = 0;
  rd_stats->skip_txfm = '\x01';
  if (ref_best_rd < 0) {
    return 0;
  }
  if ((x->e_mbd).is_chroma_ref != true) {
    return 1;
  }
  pMVar2 = *(x->e_mbd).mi;
  bVar3 = true;
  if ((pMVar2->field_0xa7 & 0x80) == 0) {
    bVar3 = '\0' < pMVar2->ref_frame[0];
  }
  plane_bsize = av1_ss_size_lookup[bsize][(x->e_mbd).plane[1].subsampling_x]
                [(x->e_mbd).plane[1].subsampling_y];
  if (bVar3) {
    iVar6 = 1;
    do {
      av1_subtract_plane(x,plane_bsize,iVar6);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 3);
  }
  pMVar2 = *(x->e_mbd).mi;
  tx_size = 0;
  if ((x->e_mbd).lossless[*(ushort *)&pMVar2->field_0xa7 & 7] != 0) goto LAB_0023ea33;
  bVar1 = ""[av1_ss_size_lookup[pMVar2->bsize][(x->e_mbd).plane[1].subsampling_x]
             [(x->e_mbd).plane[1].subsampling_y]];
  if (bVar1 < 0x11) {
    tx_size = 3;
    if ((bVar1 - 0xb < 2) || (tx_size = 3, bVar1 == 4)) goto LAB_0023ea33;
  }
  else {
    if (bVar1 == 0x11) {
      tx_size = 9;
      goto LAB_0023ea33;
    }
    if (bVar1 == 0x12) {
      tx_size = 10;
      goto LAB_0023ea33;
    }
  }
  tx_size = bVar1;
LAB_0023ea33:
  iVar7 = 1;
  lVar10 = 0;
  lVar9 = 0;
  iVar6 = 1;
  do {
    lVar5 = lVar9;
    if (lVar10 < lVar9) {
      lVar5 = lVar10;
    }
    lVar8 = 0;
    if ((cpi->sf).inter_sf.perform_best_rd_based_gating_for_chroma == 0) {
      lVar5 = lVar8;
    }
    if (ref_best_rd == 0x7fffffffffffffff) {
      lVar5 = lVar8;
    }
    if (!bVar3) {
      lVar5 = lVar8;
    }
    av1_txfm_rd_in_plane
              (x,cpi,&this_rd_stats,ref_best_rd - lVar5,0,iVar6,plane_bsize,tx_size,'\0',0);
    bVar11 = true;
    iVar4 = 0;
    if ((long)this_rd_stats.rate != 0x7fffffff) {
      if ((long)rd_stats->rate == 0x7fffffff) {
        rd_stats->rate = 0x7fffffff;
        rd_stats->zero_rate = 0;
        rd_stats->dist = 0x7fffffffffffffff;
        rd_stats->rdcost = 0x7fffffffffffffff;
        rd_stats->sse = 0x7fffffffffffffff;
        rd_stats->skip_txfm = '\0';
      }
      else {
        lVar9 = (long)rd_stats->rate + (long)this_rd_stats.rate;
        if (0x7ffffffe < lVar9) {
          lVar9 = 0x7fffffff;
        }
        rd_stats->rate = (int)lVar9;
        if (rd_stats->zero_rate == 0) {
          rd_stats->zero_rate = this_rd_stats.zero_rate;
        }
        rd_stats->dist = rd_stats->dist + this_rd_stats.dist;
        if ((rd_stats->sse != 0x7fffffffffffffff) && (this_rd_stats.sse != 0x7fffffffffffffff)) {
          rd_stats->sse = this_rd_stats.sse + rd_stats->sse;
        }
        rd_stats->skip_txfm = rd_stats->skip_txfm & this_rd_stats.skip_txfm;
      }
      lVar10 = rd_stats->dist * 0x80 + ((long)x->rdmult * (long)rd_stats->rate + 0x100 >> 9);
      lVar9 = rd_stats->sse * 0x80;
      lVar5 = lVar9;
      if (lVar10 < lVar9) {
        lVar5 = lVar10;
      }
      bVar11 = ref_best_rd < lVar5;
      iVar4 = iVar7;
      if (ref_best_rd < lVar5) {
        iVar4 = 0;
      }
    }
    iVar7 = iVar4;
  } while ((!bVar11) && (bVar11 = iVar6 != 2, iVar6 = iVar6 + 1, bVar11));
  if (iVar7 == 0) {
    rd_stats->rate = 0x7fffffff;
    rd_stats->zero_rate = 0;
    rd_stats->dist = 0x7fffffffffffffff;
    rd_stats->rdcost = 0x7fffffffffffffff;
    rd_stats->sse = 0x7fffffffffffffff;
    rd_stats->skip_txfm = '\0';
  }
  return iVar7;
}

Assistant:

int av1_txfm_uvrd(const AV1_COMP *const cpi, MACROBLOCK *x, RD_STATS *rd_stats,
                  BLOCK_SIZE bsize, int64_t ref_best_rd) {
  av1_init_rd_stats(rd_stats);
  if (ref_best_rd < 0) return 0;
  if (!x->e_mbd.is_chroma_ref) return 1;

  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_U];
  const int is_inter = is_inter_block(mbmi);
  int64_t this_rd = 0, skip_txfm_rd = 0;
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);

  if (is_inter) {
    for (int plane = 1; plane < MAX_MB_PLANE; ++plane)
      av1_subtract_plane(x, plane_bsize, plane);
  }

  const int skip_trellis = 0;
  const TX_SIZE uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
  int is_cost_valid = 1;
  for (int plane = 1; plane < MAX_MB_PLANE; ++plane) {
    RD_STATS this_rd_stats;
    int64_t chroma_ref_best_rd = ref_best_rd;
    // For inter blocks, refined ref_best_rd is used for early exit
    // For intra blocks, even though current rd crosses ref_best_rd, early
    // exit is not recommended as current rd is used for gating subsequent
    // modes as well (say, for angular modes)
    // TODO(any): Extend the early exit mechanism for intra modes as well
    if (cpi->sf.inter_sf.perform_best_rd_based_gating_for_chroma && is_inter &&
        chroma_ref_best_rd != INT64_MAX)
      chroma_ref_best_rd = ref_best_rd - AOMMIN(this_rd, skip_txfm_rd);
    av1_txfm_rd_in_plane(x, cpi, &this_rd_stats, chroma_ref_best_rd, 0, plane,
                         plane_bsize, uv_tx_size, FTXS_NONE, skip_trellis);
    if (this_rd_stats.rate == INT_MAX) {
      is_cost_valid = 0;
      break;
    }
    av1_merge_rd_stats(rd_stats, &this_rd_stats);
    this_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
    skip_txfm_rd = RDCOST(x->rdmult, 0, rd_stats->sse);
    if (AOMMIN(this_rd, skip_txfm_rd) > ref_best_rd) {
      is_cost_valid = 0;
      break;
    }
  }

  if (!is_cost_valid) {
    // reset cost value
    av1_invalid_rd_stats(rd_stats);
  }

  return is_cost_valid;
}